

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

void __thiscall ArrayType::ArrayType(ArrayType *this,ArrayType *other)

{
  (this->super_Type).kind = TK_ArrayType;
  (this->super_Type).isConst = false;
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__ArrayType_0017f848;
  (this->structName)._M_dataplus._M_p = (pointer)&(this->structName).field_2;
  (this->structName)._M_string_length = 0;
  (this->structName).field_2._M_local_buf[0] = '\0';
  this->size = other->size;
  this->type = other->type;
  this->isStructArray = other->isStructArray;
  std::__cxx11::string::_M_assign((string *)&this->structName);
  this->isPointerArray = other->isPointerArray;
  this->pointer = other->pointer;
  return;
}

Assistant:

ArrayType::ArrayType(const ArrayType& other): Type(TK_ArrayType) {
    size = other.size;
    type = other.type;
    isStructArray = other.isStructArray;
    structName = other.structName;
    isPointerArray = other.isPointerArray;
    pointer = other.pointer;
}